

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixxx.cc
# Opt level: O0

void __thiscall ixxx::socket::gai_foo::test_method(gai_foo *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *prev;
  sys_error *ex;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[50],_const_char_(&)[50]> local_d8;
  assertion_result local_b8;
  basic_cstring<const_char> local_a0;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80 [2];
  basic_cstring<const_char> local_60;
  addrinfo *local_50;
  addrinfo *res;
  addrinfo hints;
  gai_foo *this_local;
  
  hints.ai_next = (addrinfo *)this;
  memset(&res,0,0x30);
  hints.ai_flags = 1;
  local_50 = (addrinfo *)0x0;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
               ,0x5a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(local_80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x102,local_80);
    posix::getaddrinfo("example.invalid","123",(addrinfo *)&res,&local_50);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
                 ,0x5a);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a0);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x102,&local_a0);
      boost::test_tools::assertion_result::assertion_result(&local_b8,false);
      prev = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (&local_d8,prev,(char (*) [50])"exception ixxx::sys_error expected but not raised");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&ex,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gsauthof[P]libixxx/unittest/ixxx.cc"
                 ,0x5a);
      boost::test_tools::tt_detail::report_assertion(&local_b8,&local_d8,&ex,0x102,1,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[50],_const_char_(&)[50]>::
      ~lazy_ostream_impl(&local_d8);
      boost::test_tools::assertion_result::~assertion_result(&local_b8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(gai_foo)
    {
        struct addrinfo hints = {
            .ai_family   = AF_UNSPEC,
            .ai_socktype = SOCK_STREAM
        };
        struct addrinfo *res = 0;
        BOOST_CHECK_EXCEPTION(ixxx::posix::getaddrinfo("example.invalid", "123", &hints, &res),
                ixxx::sys_error,
                [](const sys_error &e) { return !!strstr(e.what(), "not known"); }
                );

    }